

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O1

Prefix * duckdb::Prefix::NewInternal
                   (Prefix *__return_storage_ptr__,ART *art,Node *node,data_ptr_t data,uint8_t count
                   ,idx_t offset,NType type)

{
  byte bVar1;
  type paVar2;
  IndexPointer IVar3;
  Node ptr_p;
  
  paVar2 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  bVar1 = Node::GetAllocatorIdx(type);
  IVar3 = FixedSizeAllocator::New
                    ((FixedSizeAllocator *)
                     paVar2->_M_elems[bVar1].
                     super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                     .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>);
  ptr_p.super_IndexPointer.data =
       (IndexPointer)((ulong)type << 0x38 | IVar3.data & 0xffffffffffffff);
  (node->super_IndexPointer).data = (idx_t)ptr_p;
  Prefix(__return_storage_ptr__,art,ptr_p,true,false);
  __return_storage_ptr__->data[art->prefix_count] = count;
  if (data != (data_ptr_t)0x0) {
    switchD_012dd528::default(__return_storage_ptr__->data,data + offset,(ulong)count);
  }
  return __return_storage_ptr__;
}

Assistant:

Prefix Prefix::NewInternal(ART &art, Node &node, const data_ptr_t data, const uint8_t count, const idx_t offset,
                           const NType type) {
	node = Node::GetAllocator(art, type).New();
	node.SetMetadata(static_cast<uint8_t>(type));

	Prefix prefix(art, node, true);
	prefix.data[Count(art)] = count;
	if (data) {
		D_ASSERT(count);
		memcpy(prefix.data, data + offset, count);
	}
	return prefix;
}